

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O2

void anon_unknown.dwarf_4f9a9::testMatrix(M33f *M)

{
  uint __line;
  float __x;
  bool bVar1;
  ostream *poVar2;
  float (*v) [3];
  long lVar3;
  long lVar4;
  float fVar5;
  float r;
  float h;
  Vec2<float> local_88;
  Vec2<float> local_80;
  M33f D;
  M33f N;
  
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_80.x = 0.0;
  local_80.y = 0.0;
  r = 0.0;
  bVar1 = Imath_2_5::extractSHRT<float>(M,&local_88,&h,&r,&local_80,true);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar2);
    __line = 0x4f;
LAB_0011e2f7:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testExtractSHRT.cpp"
                  ,__line,"void (anonymous namespace)::testMatrix(const M33f)");
  }
  N.x[1][2] = 0.0;
  N.x[2][0] = 0.0;
  N.x[2][1] = 0.0;
  N.x[0][1] = 0.0;
  N.x[0][2] = 0.0;
  N.x[1][0] = 0.0;
  N.x[0][0] = 1.0;
  N.x[1][1] = 1.0;
  N.x[2][2] = 1.0;
  D.x[1][2] = 0.0;
  D.x[2][0] = 0.0;
  D.x[2][1] = 0.0;
  D.x[0][1] = 0.0;
  D.x[0][2] = 0.0;
  D.x[1][0] = 0.0;
  D.x[0][0] = local_88.x;
  D.x[1][1] = local_88.y;
  D.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&N,&D);
  D.x[0][0] = 1.0;
  D.x[0][1] = 0.0;
  D.x[0][2] = 0.0;
  D.x[1][0] = h;
  D.x[1][1] = 1.0;
  D.x[1][2] = 0.0;
  D.x[2][0] = 0.0;
  D.x[2][1] = 0.0;
  D.x[2][2] = 1.0;
  Imath_2_5::Matrix33<float>::operator*=(&N,&D);
  __x = r;
  fVar5 = cosf(r);
  D.x[0][1] = sinf(__x);
  D.x[0][2] = 0.0;
  D.x[1][0] = -D.x[0][1];
  D.x[1][2] = 0.0;
  D.x[2][0] = 0.0;
  D.x[2][1] = 0.0;
  D.x[2][2] = 1.0;
  D.x[0][0] = fVar5;
  D.x[1][1] = fVar5;
  Imath_2_5::Matrix33<float>::operator*=(&N,&D);
  D.x[0][0] = 1.0;
  D.x[0][1] = 0.0;
  D.x[0][2] = 0.0;
  D.x[1][0] = 0.0;
  D.x[2][0] = local_80.x;
  D.x[2][1] = local_80.y;
  D.x[1][1] = 1.0;
  D.x[1][2] = 0.0;
  D.x[2][2] = 1.0;
  v = (float (*) [3])&D;
  Imath_2_5::Matrix33<float>::operator*=(&N,(Matrix33<float> *)v);
  Imath_2_5::Matrix33<float>::operator-(M,&N);
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      return;
    }
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if (1e-05 < ABS((*(float (*) [3])*v)[lVar3])) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*v)[lVar3]);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_2_5::operator<<(poVar2,M);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_2_5::operator<<(poVar2,&N);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_2_5::operator<<(poVar2,&D);
        std::endl<char,std::char_traits<char>>(poVar2);
        __line = 0x75;
        goto LAB_0011e2f7;
      }
    }
    lVar4 = lVar4 + 1;
    v = v + 1;
  } while( true );
}

Assistant:

void
testMatrix (const M33f M)
{
    //
    // Extract the rotation angle from M, and convert the
    // angle back to a matrix, N.
    //

    V2f s(0.f), t(0.f);
    float h, r= 0.f;
  
    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert(false);
    }

    M33f N;

    N *= M33f().setScale (s);
    N *= M33f().setShear (h);
    N *= M33f().setRotation (r);
    N *= M33f().setTranslation (t);

    debug (("Re-scale: %f %f\n", s[0], s[1]));
    debug (("Re-shear: %f\n", h));
    debug (("Re-rot  : %f\n", r));
    debug (("Re-trans: %f %f\n", t[0], t[1]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M33f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
	for (int k = 0; k < 3; ++k)
	{
	    if (abs (D[j][k]) > 0.00001)
	    {
		cout << "unexpectedly large matrix to "
			"euler angles conversion error: " <<
			D[j][k] << endl;

		cout << j << " " << k << endl;

		cout << "M\n" << M << endl;
		cout << "N\n" << N << endl;
		cout << "D\n" << D << endl;

		assert (false);
	    }
	}
    }
}